

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall leveldb::log::_Test_MarginalTrailer2::_Run(_Test_MarginalTrailer2 *this)

{
  allocator local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  Tester local_1b8;
  
  std::__cxx11::string::string((string *)&local_218,"foo",(allocator *)&local_1f8);
  BigString((string *)&local_1b8,&local_218,0x7ff2);
  LogTest::Write(&this->super_LogTest,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x139);
  local_1f8._M_dataplus._M_p._0_4_ = 0x7ff9;
  local_218._M_dataplus._M_p = (pointer)(this->super_LogTest).dest_.contents_._M_string_length;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,(int *)&local_1f8,(unsigned_long *)&local_218);
  test::Tester::~Tester(&local_1b8);
  std::__cxx11::string::string((string *)&local_1b8,"bar",(allocator *)&local_218);
  LogTest::Write(&this->super_LogTest,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13b);
  std::__cxx11::string::string((string *)&local_1f8,"foo",&local_219);
  BigString(&local_218,&local_1f8,0x7ff2);
  LogTest::Read_abi_cxx11_(&local_1d8,&this->super_LogTest);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1b8,&local_218,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13c);
  LogTest::Read_abi_cxx11_(&local_218,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1b8,(char (*) [4])"bar",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13d);
  LogTest::Read_abi_cxx11_(&local_218,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1b8,(char (*) [4])"EOF",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13e);
  local_1f8._M_dataplus._M_p._0_4_ = 0;
  local_218._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,(int *)&local_1f8,(unsigned_long *)&local_218);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13f);
  std::__cxx11::string::string
            ((string *)&local_218,(string *)&(this->super_LogTest).report_.message_);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&local_1b8,(char (*) [1])0x10e022,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(LogTest, MarginalTrailer2) {
  // Make a trailer that is exactly the same length as an empty record.
  const int n = kBlockSize - 2 * kHeaderSize;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize, WrittenBytes());
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}